

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipField(ParserImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  undefined1 *puVar3;
  bool bVar4;
  int iVar5;
  _Alloc_hider _Var6;
  string field_name;
  string local_90;
  string local_70;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"[","");
  bVar4 = TryConsume(this,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (bVar4) {
    bVar4 = ConsumeTypeUrlOrFullTypeName(this);
    if (!bVar4) {
      return false;
    }
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"]","");
    bVar4 = Consume(this,&local_90);
  }
  else {
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)paVar1;
    bVar4 = ConsumeIdentifier(this,&local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (bVar4 != false) {
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,":","");
    bVar4 = TryConsume(this,&local_90);
    if (bVar4) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{","");
      _Var6._M_p = local_70._M_dataplus._M_p;
      sVar2 = (this->tokenizer_).current_.text._M_string_length;
      if ((sVar2 == local_70._M_string_length) &&
         ((sVar2 == 0 ||
          (iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_70._M_dataplus._M_p,
                        sVar2), iVar5 == 0)))) {
        bVar4 = false;
      }
      else {
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"<","");
        puVar3 = local_50;
        sVar2 = (this->tokenizer_).current_.text._M_string_length;
        if (sVar2 == local_48) {
          if (sVar2 == 0) {
            bVar4 = false;
          }
          else {
            iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_50,sVar2);
            bVar4 = iVar5 != 0;
          }
        }
        else {
          bVar4 = true;
        }
        _Var6._M_p = local_70._M_dataplus._M_p;
        if (puVar3 != local_40) {
          operator_delete(puVar3);
          _Var6._M_p = local_70._M_dataplus._M_p;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_70.field_2) {
        operator_delete(_Var6._M_p);
      }
    }
    else {
      bVar4 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (bVar4) {
      bVar4 = SkipFieldValue(this);
    }
    else {
      bVar4 = SkipFieldMessage(this);
    }
    if (bVar4 != false) {
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,";","");
      bVar4 = TryConsume(this,&local_90);
      if (!bVar4) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,",","");
        TryConsume(this,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool SkipField() {
    if (TryConsume("[")) {
      // Extension name or type URL.
      DO(ConsumeTypeUrlOrFullTypeName());
      DO(Consume("]"));
    } else {
      std::string field_name;
      DO(ConsumeIdentifier(&field_name));
    }

    // Try to guess the type of this field.
    // If this field is not a message, there should be a ":" between the
    // field name and the field value and also the field value should not
    // start with "{" or "<" which indicates the beginning of a message body.
    // If there is no ":" or there is a "{" or "<" after ":", this field has
    // to be a message or the input is ill-formed.
    if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
      DO(SkipFieldValue());
    } else {
      DO(SkipFieldMessage());
    }
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");
    return true;
  }